

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O0

void Acb_ObjRemoveFanins(Acb_Ntk_t *p,int iObj)

{
  int *piVar1;
  int *pFanins;
  int i;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  piVar1 = Acb_ObjFanins(p,iObj);
  pFanins._0_4_ = 1;
  while( true ) {
    if (*piVar1 < (int)pFanins) {
      *piVar1 = 0;
      return;
    }
    if (piVar1[(int)pFanins] < 1) break;
    piVar1[(int)pFanins] = -1;
    pFanins._0_4_ = (int)pFanins + 1;
  }
  __assert_fail("pFanins[i] > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                ,0x1c8,"void Acb_ObjRemoveFanins(Acb_Ntk_t *, int)");
}

Assistant:

static inline void Acb_ObjRemoveFanins( Acb_Ntk_t * p, int iObj )
{
    int i, * pFanins = Acb_ObjFanins( p, iObj );
    for ( i = 1; i <= pFanins[0]; i++ )
    {
        assert( pFanins[i] > 0 );
        pFanins[i] = -1;
    }
    pFanins[0] = 0;
}